

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_input_pack8_avx
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  long lVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long *in_RSI;
  long *in_RDI;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  __m256 _r0tm6;
  __m256 _r0tm5;
  __m256 _tmp56b_1;
  __m256 _tmp56a_1;
  __m256 _r0tm4;
  __m256 _r0tm3;
  __m256 _tmp34b_1;
  __m256 _tmp34a_1;
  __m256 _r0tm2;
  __m256 _r0tm1;
  __m256 _tmp12b_1;
  __m256 _tmp12a_1;
  __m256 _r0tm7;
  __m256 _r0tm0;
  __m256 _tmp07;
  __m256 _tmp06;
  __m256 _tmp05;
  __m256 _tmp04;
  __m256 _tmp03;
  __m256 _tmp02;
  __m256 _tmp01;
  __m256 _tmp00;
  int m_3;
  float *r0_tm_7;
  float *r0_tm_6;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m256 _tmp6m;
  __m256 _tmp5m;
  __m256 _tmp56b;
  __m256 _tmp56a;
  __m256 _tmp4m;
  __m256 _tmp3m;
  __m256 _tmp34b;
  __m256 _tmp34a;
  __m256 _tmp2m;
  __m256 _tmp1m;
  __m256 _tmp12b;
  __m256 _tmp12a;
  __m256 _tmp7m;
  __m256 _tmp0m;
  __m256 _r07;
  __m256 _r06;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [8] [8] [8];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  int local_35a4;
  undefined1 (*local_35a0) [32];
  undefined8 *local_3598;
  undefined8 *local_3590;
  undefined8 *local_3588;
  undefined8 *local_3580;
  undefined8 *local_3578;
  undefined8 *local_3570;
  undefined8 *local_3568;
  int local_3294;
  undefined1 (*local_3290) [32];
  int local_3288;
  int local_3284;
  undefined8 local_3280 [224];
  undefined1 auStack_2b80 [272];
  long local_2a70;
  int local_29dc;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23a0;
  float fStack_239c;
  float fStack_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  float fStack_2324;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  float local_2280;
  float fStack_227c;
  float fStack_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float fStack_2268;
  float fStack_2264;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float fStack_2204;
  float local_21c0;
  float fStack_21bc;
  float fStack_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  float fStack_21a8;
  float fStack_21a4;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  float fStack_2144;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float fStack_20e4;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float fStack_1fc8;
  float fStack_1fc4;
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  float local_1ec0;
  float fStack_1ebc;
  float fStack_1eb8;
  float fStack_1eb4;
  float fStack_1eb0;
  float fStack_1eac;
  float fStack_1ea8;
  float fStack_1ea4;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  float local_1e00;
  float fStack_1dfc;
  float fStack_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  float fStack_1de8;
  float fStack_1de4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  float local_19e0;
  float fStack_19dc;
  float fStack_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float fStack_19c8;
  float fStack_19c4;
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  float fStack_15e4;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float local_ea0;
  float fStack_e9c;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float local_de0;
  float fStack_ddc;
  float fStack_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float fStack_dc8;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar57 = in_RDI[7];
  iVar58 = (iVar1 + -2) / 6;
  iVar59 = ((int)in_RDI[6] + -2) / 6;
  iVar60 = iVar58 * iVar59;
  for (local_29dc = 0; local_29dc < (int)lVar57; local_29dc = local_29dc + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    local_2a70 = *in_RSI + in_RSI[8] * (long)local_29dc * in_RSI[2];
    for (local_3284 = 0; local_3284 < iVar59; local_3284 = local_3284 + 1) {
      for (local_3288 = 0; local_3288 < iVar58; local_3288 = local_3288 + 1) {
        local_3290 = (undefined1 (*) [32])
                     (lVar3 + lVar4 * local_29dc * lVar5 +
                      (long)iVar2 * (long)(local_3284 * 6) * lVar6 + (long)(local_3288 * 0x30) * 4);
        for (local_3294 = 0; local_3294 < 8; local_3294 = local_3294 + 1) {
          uVar15 = *(undefined8 *)local_3290[1];
          uVar16 = *(undefined8 *)local_3290[2];
          uVar17 = *(undefined8 *)local_3290[3];
          uVar18 = *(undefined8 *)local_3290[4];
          uVar19 = *(undefined8 *)local_3290[5];
          uVar20 = *(undefined8 *)local_3290[6];
          auVar7 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x30);
          auVar13 = vsubps_avx(local_3290[4],local_3290[2]);
          auVar14 = vsubps_avx(*local_3290,local_3290[6]);
          local_1d40 = auVar8._0_4_;
          fStack_1d3c = auVar8._4_4_;
          fStack_1d38 = auVar8._8_4_;
          fStack_1d34 = auVar8._12_4_;
          fStack_1d30 = auVar7._0_4_;
          fStack_1d2c = auVar7._4_4_;
          fStack_1d28 = auVar7._8_4_;
          fStack_1d24 = auVar7._12_4_;
          local_14a0 = auVar13._0_4_;
          fStack_149c = auVar13._4_4_;
          fStack_1498 = auVar13._8_4_;
          fStack_1494 = auVar13._12_4_;
          fStack_1490 = auVar13._16_4_;
          fStack_148c = auVar13._20_4_;
          fStack_1488 = auVar13._24_4_;
          local_1d20 = auVar14._0_4_;
          fStack_1d1c = auVar14._4_4_;
          fStack_1d18 = auVar14._8_4_;
          fStack_1d14 = auVar14._12_4_;
          fStack_1d10 = auVar14._16_4_;
          fStack_1d0c = auVar14._20_4_;
          fStack_1d08 = auVar14._24_4_;
          fStack_1d04 = auVar14._28_4_;
          auVar7 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x30);
          auVar13 = vsubps_avx(local_3290[3],local_3290[5]);
          auVar14 = vsubps_avx(local_3290[7],local_3290[1]);
          local_1da0 = auVar8._0_4_;
          fStack_1d9c = auVar8._4_4_;
          fStack_1d98 = auVar8._8_4_;
          fStack_1d94 = auVar8._12_4_;
          fStack_1d90 = auVar7._0_4_;
          fStack_1d8c = auVar7._4_4_;
          fStack_1d88 = auVar7._8_4_;
          fStack_1d84 = auVar7._12_4_;
          local_1460 = auVar13._0_4_;
          fStack_145c = auVar13._4_4_;
          fStack_1458 = auVar13._8_4_;
          fStack_1454 = auVar13._12_4_;
          fStack_1450 = auVar13._16_4_;
          fStack_144c = auVar13._20_4_;
          fStack_1448 = auVar13._24_4_;
          local_1ce0 = auVar14._0_4_;
          fStack_1cdc = auVar14._4_4_;
          fStack_1cd8 = auVar14._8_4_;
          fStack_1cd4 = auVar14._12_4_;
          fStack_1cd0 = auVar14._16_4_;
          fStack_1ccc = auVar14._20_4_;
          fStack_1cc8 = auVar14._24_4_;
          fStack_1cc4 = auVar14._28_4_;
          auVar14._4_4_ = fStack_1d9c * fStack_145c + fStack_1cdc;
          auVar14._0_4_ = local_1da0 * local_1460 + local_1ce0;
          auVar14._12_4_ = fStack_1d94 * fStack_1454 + fStack_1cd4;
          auVar14._8_4_ = fStack_1d98 * fStack_1458 + fStack_1cd8;
          auVar14._20_4_ = fStack_1d8c * fStack_144c + fStack_1ccc;
          auVar14._16_4_ = fStack_1d90 * fStack_1450 + fStack_1cd0;
          auVar14._28_4_ = fStack_1d84 + fStack_1cc4;
          auVar14._24_4_ = fStack_1d88 * fStack_1448 + fStack_1cc8;
          auVar7 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x30);
          local_14c0 = (float)uVar16;
          fStack_14bc = (float)((ulong)uVar16 >> 0x20);
          fStack_14b8 = (float)*(undefined8 *)(local_3290[2] + 8);
          fStack_14b4 = (float)((ulong)*(undefined8 *)(local_3290[2] + 8) >> 0x20);
          fStack_14b0 = (float)*(undefined8 *)(local_3290[2] + 0x10);
          fStack_14ac = (float)((ulong)*(undefined8 *)(local_3290[2] + 0x10) >> 0x20);
          fStack_14a8 = (float)*(undefined8 *)(local_3290[2] + 0x18);
          fStack_14a4 = (float)((ulong)*(undefined8 *)(local_3290[2] + 0x18) >> 0x20);
          local_14e0 = (float)uVar20;
          fStack_14dc = (float)((ulong)uVar20 >> 0x20);
          fStack_14d8 = (float)*(undefined8 *)(local_3290[6] + 8);
          fStack_14d4 = (float)((ulong)*(undefined8 *)(local_3290[6] + 8) >> 0x20);
          fStack_14d0 = (float)*(undefined8 *)(local_3290[6] + 0x10);
          fStack_14cc = (float)((ulong)*(undefined8 *)(local_3290[6] + 0x10) >> 0x20);
          fStack_14c8 = (float)*(undefined8 *)(local_3290[6] + 0x18);
          fStack_14c4 = (float)((ulong)*(undefined8 *)(local_3290[6] + 0x18) >> 0x20);
          local_1e00 = auVar8._0_4_;
          fStack_1dfc = auVar8._4_4_;
          fStack_1df8 = auVar8._8_4_;
          fStack_1df4 = auVar8._12_4_;
          fStack_1df0 = auVar7._0_4_;
          fStack_1dec = auVar7._4_4_;
          fStack_1de8 = auVar7._8_4_;
          fStack_1de4 = auVar7._12_4_;
          local_1420 = (float)uVar18;
          fStack_141c = (float)((ulong)uVar18 >> 0x20);
          fStack_1418 = (float)*(undefined8 *)(local_3290[4] + 8);
          fStack_1414 = (float)((ulong)*(undefined8 *)(local_3290[4] + 8) >> 0x20);
          fStack_1410 = (float)*(undefined8 *)(local_3290[4] + 0x10);
          fStack_140c = (float)((ulong)*(undefined8 *)(local_3290[4] + 0x10) >> 0x20);
          fStack_1408 = (float)*(undefined8 *)(local_3290[4] + 0x18);
          fVar65 = local_1e00 * local_1420 + local_14c0 + local_14e0;
          fVar70 = fStack_1dfc * fStack_141c + fStack_14bc + fStack_14dc;
          fVar75 = fStack_1df8 * fStack_1418 + fStack_14b8 + fStack_14d8;
          fVar80 = fStack_1df4 * fStack_1414 + fStack_14b4 + fStack_14d4;
          fVar85 = fStack_1df0 * fStack_1410 + fStack_14b0 + fStack_14d0;
          fVar90 = fStack_1dec * fStack_140c + fStack_14ac + fStack_14cc;
          fVar95 = fStack_1de8 * fStack_1408 + fStack_14a8 + fStack_14c8;
          fStack_1de4 = fStack_1de4 + fStack_14a4 + fStack_14c4;
          auVar56._4_4_ = fVar70;
          auVar56._0_4_ = fVar65;
          auVar56._12_4_ = fVar80;
          auVar56._8_4_ = fVar75;
          auVar56._20_4_ = fVar90;
          auVar56._16_4_ = fVar85;
          auVar56._28_4_ = fStack_1de4;
          auVar56._24_4_ = fVar95;
          auVar7 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x30);
          local_1500 = (float)uVar15;
          fStack_14fc = (float)((ulong)uVar15 >> 0x20);
          fStack_14f8 = (float)*(undefined8 *)(local_3290[1] + 8);
          fStack_14f4 = (float)((ulong)*(undefined8 *)(local_3290[1] + 8) >> 0x20);
          fStack_14f0 = (float)*(undefined8 *)(local_3290[1] + 0x10);
          fStack_14ec = (float)((ulong)*(undefined8 *)(local_3290[1] + 0x10) >> 0x20);
          fStack_14e8 = (float)*(undefined8 *)(local_3290[1] + 0x18);
          fStack_14e4 = (float)((ulong)*(undefined8 *)(local_3290[1] + 0x18) >> 0x20);
          local_1520 = (float)uVar19;
          fStack_151c = (float)((ulong)uVar19 >> 0x20);
          fStack_1518 = (float)*(undefined8 *)(local_3290[5] + 8);
          fStack_1514 = (float)((ulong)*(undefined8 *)(local_3290[5] + 8) >> 0x20);
          fStack_1510 = (float)*(undefined8 *)(local_3290[5] + 0x10);
          fStack_150c = (float)((ulong)*(undefined8 *)(local_3290[5] + 0x10) >> 0x20);
          fStack_1508 = (float)*(undefined8 *)(local_3290[5] + 0x18);
          fStack_1504 = (float)((ulong)*(undefined8 *)(local_3290[5] + 0x18) >> 0x20);
          local_1e60 = auVar8._0_4_;
          fStack_1e5c = auVar8._4_4_;
          fStack_1e58 = auVar8._8_4_;
          fStack_1e54 = auVar8._12_4_;
          fStack_1e50 = auVar7._0_4_;
          fStack_1e4c = auVar7._4_4_;
          fStack_1e48 = auVar7._8_4_;
          fStack_1e44 = auVar7._12_4_;
          local_13e0 = (float)uVar17;
          fStack_13dc = (float)((ulong)uVar17 >> 0x20);
          fStack_13d8 = (float)*(undefined8 *)(local_3290[3] + 8);
          fStack_13d4 = (float)((ulong)*(undefined8 *)(local_3290[3] + 8) >> 0x20);
          fStack_13d0 = (float)*(undefined8 *)(local_3290[3] + 0x10);
          fStack_13cc = (float)((ulong)*(undefined8 *)(local_3290[3] + 0x10) >> 0x20);
          fStack_13c8 = (float)*(undefined8 *)(local_3290[3] + 0x18);
          fVar66 = local_1e60 * local_13e0 + local_1500 + local_1520;
          fVar71 = fStack_1e5c * fStack_13dc + fStack_14fc + fStack_151c;
          fVar76 = fStack_1e58 * fStack_13d8 + fStack_14f8 + fStack_1518;
          fVar81 = fStack_1e54 * fStack_13d4 + fStack_14f4 + fStack_1514;
          fVar86 = fStack_1e50 * fStack_13d0 + fStack_14f0 + fStack_1510;
          fVar91 = fStack_1e4c * fStack_13cc + fStack_14ec + fStack_150c;
          fVar96 = fStack_1e48 * fStack_13c8 + fStack_14e8 + fStack_1508;
          fStack_1e44 = fStack_1e44 + fStack_14e4 + fStack_1504;
          auVar55._4_4_ = fVar71;
          auVar55._0_4_ = fVar66;
          auVar55._12_4_ = fVar81;
          auVar55._8_4_ = fVar76;
          auVar55._20_4_ = fVar91;
          auVar55._16_4_ = fVar86;
          auVar55._28_4_ = fStack_1e44;
          auVar55._24_4_ = fVar96;
          auVar13 = vsubps_avx(auVar56,auVar55);
          local_3ae0 = auVar13._0_8_;
          uStack_3ad8 = auVar13._8_8_;
          uStack_3ad0 = auVar13._16_8_;
          uStack_3ac8 = auVar13._24_8_;
          auVar7 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbfa00000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbfa00000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbfa00000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbfa00000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3e800000),ZEXT416(0x3e800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3e800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3e800000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0x3e800000),ZEXT416(0x3e800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3e800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3e800000),0x30);
          local_1ec0 = auVar10._0_4_;
          fStack_1ebc = auVar10._4_4_;
          fStack_1eb8 = auVar10._8_4_;
          fStack_1eb4 = auVar10._12_4_;
          fStack_1eb0 = auVar9._0_4_;
          fStack_1eac = auVar9._4_4_;
          fStack_1ea8 = auVar9._8_4_;
          fStack_1ea4 = auVar9._12_4_;
          local_1f20 = auVar8._0_4_;
          fStack_1f1c = auVar8._4_4_;
          fStack_1f18 = auVar8._8_4_;
          fStack_1f14 = auVar8._12_4_;
          fStack_1f10 = auVar7._0_4_;
          fStack_1f0c = auVar7._4_4_;
          fStack_1f08 = auVar7._8_4_;
          fStack_1f04 = auVar7._12_4_;
          fVar67 = local_1f20 * local_1420 + local_1ec0 * local_14c0 + local_14e0;
          fVar72 = fStack_1f1c * fStack_141c + fStack_1ebc * fStack_14bc + fStack_14dc;
          fVar77 = fStack_1f18 * fStack_1418 + fStack_1eb8 * fStack_14b8 + fStack_14d8;
          fVar82 = fStack_1f14 * fStack_1414 + fStack_1eb4 * fStack_14b4 + fStack_14d4;
          fVar87 = fStack_1f10 * fStack_1410 + fStack_1eb0 * fStack_14b0 + fStack_14d0;
          fVar92 = fStack_1f0c * fStack_140c + fStack_1eac * fStack_14ac + fStack_14cc;
          fVar97 = fStack_1f08 * fStack_1408 + fStack_1ea8 * fStack_14a8 + fStack_14c8;
          fStack_1f04 = fStack_1f04 + fStack_1ea4 + fStack_14c4;
          auVar54._4_4_ = fVar72;
          auVar54._0_4_ = fVar67;
          auVar54._12_4_ = fVar82;
          auVar54._8_4_ = fVar77;
          auVar54._20_4_ = fVar92;
          auVar54._16_4_ = fVar87;
          auVar54._28_4_ = fStack_1f04;
          auVar54._24_4_ = fVar97;
          auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f000000),0x30);
          local_de0 = auVar12._0_4_;
          fStack_ddc = auVar12._4_4_;
          fStack_dd8 = auVar12._8_4_;
          fStack_dd4 = auVar12._12_4_;
          fStack_dd0 = auVar11._0_4_;
          fStack_dcc = auVar11._4_4_;
          fStack_dc8 = auVar11._8_4_;
          local_1f80 = auVar10._0_4_;
          fStack_1f7c = auVar10._4_4_;
          fStack_1f78 = auVar10._8_4_;
          fStack_1f74 = auVar10._12_4_;
          fStack_1f70 = auVar9._0_4_;
          fStack_1f6c = auVar9._4_4_;
          fStack_1f68 = auVar9._8_4_;
          fStack_1f64 = auVar9._12_4_;
          local_1fe0 = auVar8._0_4_;
          fStack_1fdc = auVar8._4_4_;
          fStack_1fd8 = auVar8._8_4_;
          fStack_1fd4 = auVar8._12_4_;
          fStack_1fd0 = auVar7._0_4_;
          fStack_1fcc = auVar7._4_4_;
          fStack_1fc8 = auVar7._8_4_;
          fStack_1fc4 = auVar7._12_4_;
          fVar68 = local_1fe0 * local_1520 + local_1f80 * local_13e0 + local_1500 * local_de0;
          fVar73 = fStack_1fdc * fStack_151c + fStack_1f7c * fStack_13dc + fStack_14fc * fStack_ddc;
          fVar78 = fStack_1fd8 * fStack_1518 + fStack_1f78 * fStack_13d8 + fStack_14f8 * fStack_dd8;
          fVar83 = fStack_1fd4 * fStack_1514 + fStack_1f74 * fStack_13d4 + fStack_14f4 * fStack_dd4;
          fVar88 = fStack_1fd0 * fStack_1510 + fStack_1f70 * fStack_13d0 + fStack_14f0 * fStack_dd0;
          fVar93 = fStack_1fcc * fStack_150c + fStack_1f6c * fStack_13cc + fStack_14ec * fStack_dcc;
          fVar98 = fStack_1fc8 * fStack_1508 + fStack_1f68 * fStack_13c8 + fStack_14e8 * fStack_dc8;
          fStack_1fc4 = fStack_1fc4 + fStack_1f64 + fStack_14e4;
          auVar53._4_4_ = fVar73;
          auVar53._0_4_ = fVar68;
          auVar53._12_4_ = fVar83;
          auVar53._8_4_ = fVar78;
          auVar53._20_4_ = fVar93;
          auVar53._16_4_ = fVar88;
          auVar53._28_4_ = fStack_1fc4;
          auVar53._24_4_ = fVar98;
          auVar13 = vsubps_avx(auVar54,auVar53);
          local_3d40 = auVar13._0_8_;
          uStack_3d38 = auVar13._8_8_;
          uStack_3d30 = auVar13._16_8_;
          uStack_3d28 = auVar13._24_8_;
          auVar7 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40800000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40800000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbfa00000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbfa00000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbfa00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbfa00000),0x30);
          local_2040 = auVar10._0_4_;
          fStack_203c = auVar10._4_4_;
          fStack_2038 = auVar10._8_4_;
          fStack_2034 = auVar10._12_4_;
          fStack_2030 = auVar9._0_4_;
          fStack_202c = auVar9._4_4_;
          fStack_2028 = auVar9._8_4_;
          local_20a0 = auVar8._0_4_;
          fStack_209c = auVar8._4_4_;
          fStack_2098 = auVar8._8_4_;
          fStack_2094 = auVar8._12_4_;
          fStack_2090 = auVar7._0_4_;
          fStack_208c = auVar7._4_4_;
          fStack_2088 = auVar7._8_4_;
          fStack_2084 = auVar7._12_4_;
          local_14e0 = local_20a0 * (local_2040 * local_1420 + local_14c0) + local_14e0;
          fStack_14dc = fStack_209c * (fStack_203c * fStack_141c + fStack_14bc) + fStack_14dc;
          fStack_14d8 = fStack_2098 * (fStack_2038 * fStack_1418 + fStack_14b8) + fStack_14d8;
          fStack_14d4 = fStack_2094 * (fStack_2034 * fStack_1414 + fStack_14b4) + fStack_14d4;
          fStack_14d0 = fStack_2090 * (fStack_2030 * fStack_1410 + fStack_14b0) + fStack_14d0;
          fStack_14cc = fStack_208c * (fStack_202c * fStack_140c + fStack_14ac) + fStack_14cc;
          fStack_14c8 = fStack_2088 * (fStack_2028 * fStack_1408 + fStack_14a8) + fStack_14c8;
          auVar52._4_4_ = fStack_14dc;
          auVar52._0_4_ = local_14e0;
          auVar52._12_4_ = fStack_14d4;
          auVar52._8_4_ = fStack_14d8;
          auVar52._20_4_ = fStack_14cc;
          auVar52._16_4_ = fStack_14d0;
          auVar52._28_4_ = fStack_2084 + fStack_14c4;
          auVar52._24_4_ = fStack_14c8;
          auVar7 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f000000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x30);
          local_e20 = auVar12._0_4_;
          fStack_e1c = auVar12._4_4_;
          fStack_e18 = auVar12._8_4_;
          fStack_e14 = auVar12._12_4_;
          fStack_e10 = auVar11._0_4_;
          fStack_e0c = auVar11._4_4_;
          fStack_e08 = auVar11._8_4_;
          local_2100 = auVar10._0_4_;
          fStack_20fc = auVar10._4_4_;
          fStack_20f8 = auVar10._8_4_;
          fStack_20f4 = auVar10._12_4_;
          fStack_20f0 = auVar9._0_4_;
          fStack_20ec = auVar9._4_4_;
          fStack_20e8 = auVar9._8_4_;
          fStack_20e4 = auVar9._12_4_;
          local_2160 = auVar8._0_4_;
          fStack_215c = auVar8._4_4_;
          fStack_2158 = auVar8._8_4_;
          fStack_2154 = auVar8._12_4_;
          fStack_2150 = auVar7._0_4_;
          fStack_214c = auVar7._4_4_;
          fStack_2148 = auVar7._8_4_;
          fStack_2144 = auVar7._12_4_;
          fVar69 = local_2160 * local_1520 + local_2100 * local_13e0 + local_1500 * local_e20;
          fVar74 = fStack_215c * fStack_151c + fStack_20fc * fStack_13dc + fStack_14fc * fStack_e1c;
          fVar79 = fStack_2158 * fStack_1518 + fStack_20f8 * fStack_13d8 + fStack_14f8 * fStack_e18;
          fVar84 = fStack_2154 * fStack_1514 + fStack_20f4 * fStack_13d4 + fStack_14f4 * fStack_e14;
          fVar89 = fStack_2150 * fStack_1510 + fStack_20f0 * fStack_13d0 + fStack_14f0 * fStack_e10;
          fVar94 = fStack_214c * fStack_150c + fStack_20ec * fStack_13cc + fStack_14ec * fStack_e0c;
          fVar99 = fStack_2148 * fStack_1508 + fStack_20e8 * fStack_13c8 + fStack_14e8 * fStack_e08;
          fStack_2144 = fStack_2144 + fStack_20e4 + fStack_14e4;
          auVar13._4_4_ = fVar74;
          auVar13._0_4_ = fVar69;
          auVar13._12_4_ = fVar84;
          auVar13._8_4_ = fVar79;
          auVar13._20_4_ = fVar94;
          auVar13._16_4_ = fVar89;
          auVar13._28_4_ = fStack_2144;
          auVar13._24_4_ = fVar99;
          auVar13 = vsubps_avx(auVar52,auVar13);
          local_3f80 = auVar13._0_8_;
          uStack_3f78 = auVar13._8_8_;
          uStack_3f70 = auVar13._16_8_;
          uStack_3f68 = auVar13._24_8_;
          lVar64 = (long)local_3294;
          local_3280[lVar64 * 4] =
               CONCAT44(fStack_1d3c * fStack_149c + fStack_1d1c,local_1d40 * local_14a0 + local_1d20
                       );
          local_3280[lVar64 * 4 + 1] =
               CONCAT44(fStack_1d34 * fStack_1494 + fStack_1d14,
                        fStack_1d38 * fStack_1498 + fStack_1d18);
          local_3280[lVar64 * 4 + 2] =
               CONCAT44(fStack_1d2c * fStack_148c + fStack_1d0c,
                        fStack_1d30 * fStack_1490 + fStack_1d10);
          local_3280[lVar64 * 4 + 3] =
               CONCAT44(fStack_1d24 + fStack_1d04,fStack_1d28 * fStack_1488 + fStack_1d08);
          lVar64 = (long)local_3294;
          local_3280[lVar64 * 4 + 0x20] = CONCAT44(fVar70 + fVar71,fVar65 + fVar66);
          local_3280[lVar64 * 4 + 0x21] = CONCAT44(fVar80 + fVar81,fVar75 + fVar76);
          local_3280[lVar64 * 4 + 0x22] = CONCAT44(fVar90 + fVar91,fVar85 + fVar86);
          local_3280[lVar64 * 4 + 0x23] = CONCAT44(fStack_1de4 + fStack_1e44,fVar95 + fVar96);
          lVar64 = (long)local_3294;
          local_3280[lVar64 * 4 + 0x40] = local_3ae0;
          local_3280[lVar64 * 4 + 0x41] = uStack_3ad8;
          local_3280[lVar64 * 4 + 0x42] = uStack_3ad0;
          local_3280[lVar64 * 4 + 0x43] = uStack_3ac8;
          lVar64 = (long)local_3294;
          local_3280[lVar64 * 4 + 0x60] = CONCAT44(fVar72 + fVar73,fVar67 + fVar68);
          local_3280[lVar64 * 4 + 0x61] = CONCAT44(fVar82 + fVar83,fVar77 + fVar78);
          local_3280[lVar64 * 4 + 0x62] = CONCAT44(fVar92 + fVar93,fVar87 + fVar88);
          local_3280[lVar64 * 4 + 99] = CONCAT44(fStack_1f04 + fStack_1fc4,fVar97 + fVar98);
          lVar64 = (long)local_3294 * 0x20;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0x300) = local_3d40;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0x2f8) = uStack_3d38;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0x2f0) = uStack_3d30;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0x2e8) = uStack_3d28;
          lVar64 = (long)local_3294 * 0x20;
          *(ulong *)(auStack_2b80 + lVar64 + -0x200) =
               CONCAT44(fStack_14dc + fVar74,local_14e0 + fVar69);
          *(ulong *)(auStack_2b80 + lVar64 + -0x1f8) =
               CONCAT44(fStack_14d4 + fVar84,fStack_14d8 + fVar79);
          *(ulong *)(auStack_2b80 + lVar64 + -0x1f0) =
               CONCAT44(fStack_14cc + fVar94,fStack_14d0 + fVar89);
          *(ulong *)(auStack_2b80 + lVar64 + -0x1e8) =
               CONCAT44(fStack_2084 + fStack_14c4 + fStack_2144,fStack_14c8 + fVar99);
          lVar64 = (long)local_3294 * 0x20;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0x100) = local_3f80;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0xf8) = uStack_3f78;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0xf0) = uStack_3f70;
          *(undefined8 *)(auStack_2b80 + lVar64 + -0xe8) = uStack_3f68;
          *(undefined1 (*) [32])(auStack_2b80 + (long)local_3294 * 0x20) = auVar14;
          local_3290 = (undefined1 (*) [32])(*local_3290 + (long)(iVar1 << 3) * 4);
        }
        local_3568 = (undefined8 *)(local_2a70 + (long)((local_3284 * iVar58 + local_3288) * 8) * 4)
        ;
        local_3570 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 8) * 4);
        local_3578 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x10) * 4);
        local_3580 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x18) * 4);
        local_3588 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x20) * 4);
        local_3590 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x28) * 4);
        local_3598 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x30) * 4);
        local_35a0 = (undefined1 (*) [32])((long)local_3568 + (long)(iVar60 * 0x38) * 4);
        for (local_35a4 = 0; local_35a4 < 8; local_35a4 = local_35a4 + 1) {
          lVar64 = (long)local_35a4;
          lVar61 = (long)local_35a4;
          uVar15 = local_3280[lVar61 * 0x20 + 4];
          uVar16 = local_3280[lVar61 * 0x20 + 5];
          uVar17 = local_3280[lVar61 * 0x20 + 6];
          uVar18 = local_3280[lVar61 * 0x20 + 7];
          lVar61 = (long)local_35a4;
          uVar19 = local_3280[lVar61 * 0x20 + 8];
          uVar20 = local_3280[lVar61 * 0x20 + 9];
          uVar21 = local_3280[lVar61 * 0x20 + 10];
          uVar22 = local_3280[lVar61 * 0x20 + 0xb];
          lVar61 = (long)local_35a4;
          uVar23 = local_3280[lVar61 * 0x20 + 0xc];
          uVar24 = local_3280[lVar61 * 0x20 + 0xd];
          uVar25 = local_3280[lVar61 * 0x20 + 0xe];
          lVar62 = (long)local_35a4;
          uVar26 = local_3280[lVar62 * 0x20 + 0x10];
          uVar27 = local_3280[lVar62 * 0x20 + 0x11];
          uVar28 = local_3280[lVar62 * 0x20 + 0x12];
          lVar63 = (long)local_35a4;
          uVar29 = local_3280[lVar63 * 0x20 + 0x14];
          uVar30 = local_3280[lVar63 * 0x20 + 0x15];
          uVar31 = local_3280[lVar63 * 0x20 + 0x16];
          uVar32 = local_3280[lVar63 * 0x20 + 0x17];
          lVar63 = (long)local_35a4;
          uVar33 = local_3280[lVar63 * 0x20 + 0x18];
          uVar34 = local_3280[lVar63 * 0x20 + 0x19];
          uVar35 = local_3280[lVar63 * 0x20 + 0x1a];
          uVar36 = local_3280[lVar63 * 0x20 + 0x1b];
          lVar63 = (long)local_35a4;
          auVar7 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x30);
          auVar51._8_8_ = uVar27;
          auVar51._0_8_ = uVar26;
          auVar51._16_8_ = uVar28;
          auVar51._24_8_ = local_3280[lVar62 * 0x20 + 0x13];
          auVar50._8_8_ = uVar20;
          auVar50._0_8_ = uVar19;
          auVar50._16_8_ = uVar21;
          auVar50._24_8_ = uVar22;
          auVar13 = vsubps_avx(auVar51,auVar50);
          auVar49._8_8_ = local_3280[lVar64 * 0x20 + 1];
          auVar49._0_8_ = local_3280[lVar64 * 0x20];
          auVar49._16_8_ = local_3280[lVar64 * 0x20 + 2];
          auVar49._24_8_ = local_3280[lVar64 * 0x20 + 3];
          auVar48._8_8_ = uVar34;
          auVar48._0_8_ = uVar33;
          auVar48._16_8_ = uVar35;
          auVar48._24_8_ = uVar36;
          auVar14 = vsubps_avx(auVar49,auVar48);
          local_21c0 = auVar8._0_4_;
          fStack_21bc = auVar8._4_4_;
          fStack_21b8 = auVar8._8_4_;
          fStack_21b4 = auVar8._12_4_;
          fStack_21b0 = auVar7._0_4_;
          fStack_21ac = auVar7._4_4_;
          fStack_21a8 = auVar7._8_4_;
          fStack_21a4 = auVar7._12_4_;
          local_11a0 = auVar13._0_4_;
          fStack_119c = auVar13._4_4_;
          fStack_1198 = auVar13._8_4_;
          fStack_1194 = auVar13._12_4_;
          fStack_1190 = auVar13._16_4_;
          fStack_118c = auVar13._20_4_;
          fStack_1188 = auVar13._24_4_;
          local_1a20 = auVar14._0_4_;
          fStack_1a1c = auVar14._4_4_;
          fStack_1a18 = auVar14._8_4_;
          fStack_1a14 = auVar14._12_4_;
          fStack_1a10 = auVar14._16_4_;
          fStack_1a0c = auVar14._20_4_;
          fStack_1a08 = auVar14._24_4_;
          fStack_1a04 = auVar14._28_4_;
          auVar7 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40a80000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40a80000),ZEXT416(0x40a80000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40a80000),0x30);
          auVar47._8_8_ = uVar24;
          auVar47._0_8_ = uVar23;
          auVar47._16_8_ = uVar25;
          auVar47._24_8_ = local_3280[lVar61 * 0x20 + 0xf];
          auVar46._8_8_ = uVar30;
          auVar46._0_8_ = uVar29;
          auVar46._16_8_ = uVar31;
          auVar46._24_8_ = uVar32;
          auVar13 = vsubps_avx(auVar47,auVar46);
          auVar45._8_8_ = local_3280[lVar63 * 0x20 + 0x1d];
          auVar45._0_8_ = local_3280[lVar63 * 0x20 + 0x1c];
          auVar45._16_8_ = local_3280[lVar63 * 0x20 + 0x1e];
          auVar45._24_8_ = local_3280[lVar63 * 0x20 + 0x1f];
          auVar44._8_8_ = uVar16;
          auVar44._0_8_ = uVar15;
          auVar44._16_8_ = uVar17;
          auVar44._24_8_ = uVar18;
          auVar14 = vsubps_avx(auVar45,auVar44);
          local_2220 = auVar8._0_4_;
          fStack_221c = auVar8._4_4_;
          fStack_2218 = auVar8._8_4_;
          fStack_2214 = auVar8._12_4_;
          fStack_2210 = auVar7._0_4_;
          fStack_220c = auVar7._4_4_;
          fStack_2208 = auVar7._8_4_;
          fStack_2204 = auVar7._12_4_;
          local_1160 = auVar13._0_4_;
          fStack_115c = auVar13._4_4_;
          fStack_1158 = auVar13._8_4_;
          fStack_1154 = auVar13._12_4_;
          fStack_1150 = auVar13._16_4_;
          fStack_114c = auVar13._20_4_;
          fStack_1148 = auVar13._24_4_;
          local_19e0 = auVar14._0_4_;
          fStack_19dc = auVar14._4_4_;
          fStack_19d8 = auVar14._8_4_;
          fStack_19d4 = auVar14._12_4_;
          fStack_19d0 = auVar14._16_4_;
          fStack_19cc = auVar14._20_4_;
          fStack_19c8 = auVar14._24_4_;
          fStack_19c4 = auVar14._28_4_;
          auVar37._4_4_ = fStack_221c * fStack_115c + fStack_19dc;
          auVar37._0_4_ = local_2220 * local_1160 + local_19e0;
          auVar37._12_4_ = fStack_2214 * fStack_1154 + fStack_19d4;
          auVar37._8_4_ = fStack_2218 * fStack_1158 + fStack_19d8;
          auVar37._20_4_ = fStack_220c * fStack_114c + fStack_19cc;
          auVar37._16_4_ = fStack_2210 * fStack_1150 + fStack_19d0;
          auVar37._28_4_ = fStack_2204 + fStack_19c4;
          auVar37._24_4_ = fStack_2208 * fStack_1148 + fStack_19c8;
          auVar7 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x30);
          local_1600 = (float)uVar19;
          fStack_15fc = (float)((ulong)uVar19 >> 0x20);
          fStack_15f8 = (float)uVar20;
          fStack_15f4 = (float)((ulong)uVar20 >> 0x20);
          fStack_15f0 = (float)uVar21;
          fStack_15ec = (float)((ulong)uVar21 >> 0x20);
          fStack_15e8 = (float)uVar22;
          fStack_15e4 = (float)((ulong)uVar22 >> 0x20);
          local_1620 = (float)uVar33;
          fStack_161c = (float)((ulong)uVar33 >> 0x20);
          fStack_1618 = (float)uVar34;
          fStack_1614 = (float)((ulong)uVar34 >> 0x20);
          fStack_1610 = (float)uVar35;
          fStack_160c = (float)((ulong)uVar35 >> 0x20);
          fStack_1608 = (float)uVar36;
          fStack_1604 = (float)((ulong)uVar36 >> 0x20);
          local_2280 = auVar8._0_4_;
          fStack_227c = auVar8._4_4_;
          fStack_2278 = auVar8._8_4_;
          fStack_2274 = auVar8._12_4_;
          fStack_2270 = auVar7._0_4_;
          fStack_226c = auVar7._4_4_;
          fStack_2268 = auVar7._8_4_;
          fStack_2264 = auVar7._12_4_;
          local_1120 = (float)uVar26;
          fStack_111c = (float)((ulong)uVar26 >> 0x20);
          fStack_1118 = (float)uVar27;
          fStack_1114 = (float)((ulong)uVar27 >> 0x20);
          fStack_1110 = (float)uVar28;
          fStack_110c = (float)((ulong)uVar28 >> 0x20);
          fStack_1108 = (float)local_3280[lVar62 * 0x20 + 0x13];
          fVar65 = local_2280 * local_1120 + local_1600 + local_1620;
          fVar70 = fStack_227c * fStack_111c + fStack_15fc + fStack_161c;
          fVar75 = fStack_2278 * fStack_1118 + fStack_15f8 + fStack_1618;
          fVar80 = fStack_2274 * fStack_1114 + fStack_15f4 + fStack_1614;
          fVar85 = fStack_2270 * fStack_1110 + fStack_15f0 + fStack_1610;
          fVar90 = fStack_226c * fStack_110c + fStack_15ec + fStack_160c;
          fVar95 = fStack_2268 * fStack_1108 + fStack_15e8 + fStack_1608;
          fStack_2264 = fStack_2264 + fStack_15e4 + fStack_1604;
          auVar43._4_4_ = fVar70;
          auVar43._0_4_ = fVar65;
          auVar43._12_4_ = fVar80;
          auVar43._8_4_ = fVar75;
          auVar43._20_4_ = fVar90;
          auVar43._16_4_ = fVar85;
          auVar43._28_4_ = fStack_2264;
          auVar43._24_4_ = fVar95;
          auVar7 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xc0880000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xc0880000),ZEXT416(0xc0880000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xc0880000),0x30);
          local_1640 = (float)uVar15;
          fStack_163c = (float)((ulong)uVar15 >> 0x20);
          fStack_1638 = (float)uVar16;
          fStack_1634 = (float)((ulong)uVar16 >> 0x20);
          fStack_1630 = (float)uVar17;
          fStack_162c = (float)((ulong)uVar17 >> 0x20);
          fStack_1628 = (float)uVar18;
          fStack_1624 = (float)((ulong)uVar18 >> 0x20);
          local_1660 = (float)uVar29;
          fStack_165c = (float)((ulong)uVar29 >> 0x20);
          fStack_1658 = (float)uVar30;
          fStack_1654 = (float)((ulong)uVar30 >> 0x20);
          fStack_1650 = (float)uVar31;
          fStack_164c = (float)((ulong)uVar31 >> 0x20);
          fStack_1648 = (float)uVar32;
          fStack_1644 = (float)((ulong)uVar32 >> 0x20);
          local_22e0 = auVar8._0_4_;
          fStack_22dc = auVar8._4_4_;
          fStack_22d8 = auVar8._8_4_;
          fStack_22d4 = auVar8._12_4_;
          fStack_22d0 = auVar7._0_4_;
          fStack_22cc = auVar7._4_4_;
          fStack_22c8 = auVar7._8_4_;
          fStack_22c4 = auVar7._12_4_;
          local_10e0 = (float)uVar23;
          fStack_10dc = (float)((ulong)uVar23 >> 0x20);
          fStack_10d8 = (float)uVar24;
          fStack_10d4 = (float)((ulong)uVar24 >> 0x20);
          fStack_10d0 = (float)uVar25;
          fStack_10cc = (float)((ulong)uVar25 >> 0x20);
          fStack_10c8 = (float)local_3280[lVar61 * 0x20 + 0xf];
          fVar66 = local_22e0 * local_10e0 + local_1640 + local_1660;
          fVar71 = fStack_22dc * fStack_10dc + fStack_163c + fStack_165c;
          fVar76 = fStack_22d8 * fStack_10d8 + fStack_1638 + fStack_1658;
          fVar81 = fStack_22d4 * fStack_10d4 + fStack_1634 + fStack_1654;
          fVar86 = fStack_22d0 * fStack_10d0 + fStack_1630 + fStack_1650;
          fVar91 = fStack_22cc * fStack_10cc + fStack_162c + fStack_164c;
          fVar96 = fStack_22c8 * fStack_10c8 + fStack_1628 + fStack_1648;
          fStack_22c4 = fStack_22c4 + fStack_1624 + fStack_1644;
          auVar42._4_4_ = fVar71;
          auVar42._0_4_ = fVar66;
          auVar42._12_4_ = fVar81;
          auVar42._8_4_ = fVar76;
          auVar42._20_4_ = fVar91;
          auVar42._16_4_ = fVar86;
          auVar42._28_4_ = fStack_22c4;
          auVar42._24_4_ = fVar96;
          auVar13 = vsubps_avx(auVar43,auVar42);
          local_41c0 = auVar13._0_8_;
          uStack_41b8 = auVar13._8_8_;
          uStack_41b0 = auVar13._16_8_;
          uStack_41a8 = auVar13._24_8_;
          auVar7 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbfa00000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0xbfa00000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbfa00000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0xbfa00000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0x3e800000),ZEXT416(0x3e800000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3e800000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3e800000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0x3e800000),ZEXT416(0x3e800000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3e800000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3e800000),0x30);
          local_2340 = auVar10._0_4_;
          fStack_233c = auVar10._4_4_;
          fStack_2338 = auVar10._8_4_;
          fStack_2334 = auVar10._12_4_;
          fStack_2330 = auVar9._0_4_;
          fStack_232c = auVar9._4_4_;
          fStack_2328 = auVar9._8_4_;
          fStack_2324 = auVar9._12_4_;
          local_23a0 = auVar8._0_4_;
          fStack_239c = auVar8._4_4_;
          fStack_2398 = auVar8._8_4_;
          fStack_2394 = auVar8._12_4_;
          fStack_2390 = auVar7._0_4_;
          fStack_238c = auVar7._4_4_;
          fStack_2388 = auVar7._8_4_;
          fStack_2384 = auVar7._12_4_;
          fVar67 = local_23a0 * local_1120 + local_2340 * local_1600 + local_1620;
          fVar72 = fStack_239c * fStack_111c + fStack_233c * fStack_15fc + fStack_161c;
          fVar77 = fStack_2398 * fStack_1118 + fStack_2338 * fStack_15f8 + fStack_1618;
          fVar82 = fStack_2394 * fStack_1114 + fStack_2334 * fStack_15f4 + fStack_1614;
          fVar87 = fStack_2390 * fStack_1110 + fStack_2330 * fStack_15f0 + fStack_1610;
          fVar92 = fStack_238c * fStack_110c + fStack_232c * fStack_15ec + fStack_160c;
          fVar97 = fStack_2388 * fStack_1108 + fStack_2328 * fStack_15e8 + fStack_1608;
          fStack_2384 = fStack_2384 + fStack_2324 + fStack_1604;
          auVar41._4_4_ = fVar72;
          auVar41._0_4_ = fVar67;
          auVar41._12_4_ = fVar82;
          auVar41._8_4_ = fVar77;
          auVar41._20_4_ = fVar92;
          auVar41._16_4_ = fVar87;
          auVar41._28_4_ = fStack_2384;
          auVar41._24_4_ = fVar97;
          auVar7 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40000000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40000000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f000000),0x30);
          local_e60 = auVar12._0_4_;
          fStack_e5c = auVar12._4_4_;
          fStack_e58 = auVar12._8_4_;
          fStack_e54 = auVar12._12_4_;
          fStack_e50 = auVar11._0_4_;
          fStack_e4c = auVar11._4_4_;
          fStack_e48 = auVar11._8_4_;
          local_2400 = auVar10._0_4_;
          fStack_23fc = auVar10._4_4_;
          fStack_23f8 = auVar10._8_4_;
          fStack_23f4 = auVar10._12_4_;
          fStack_23f0 = auVar9._0_4_;
          fStack_23ec = auVar9._4_4_;
          fStack_23e8 = auVar9._8_4_;
          fStack_23e4 = auVar9._12_4_;
          local_2460 = auVar8._0_4_;
          fStack_245c = auVar8._4_4_;
          fStack_2458 = auVar8._8_4_;
          fStack_2454 = auVar8._12_4_;
          fStack_2450 = auVar7._0_4_;
          fStack_244c = auVar7._4_4_;
          fStack_2448 = auVar7._8_4_;
          fStack_2444 = auVar7._12_4_;
          fVar68 = local_2460 * local_1660 + local_2400 * local_10e0 + local_1640 * local_e60;
          fVar73 = fStack_245c * fStack_165c + fStack_23fc * fStack_10dc + fStack_163c * fStack_e5c;
          fVar78 = fStack_2458 * fStack_1658 + fStack_23f8 * fStack_10d8 + fStack_1638 * fStack_e58;
          fVar83 = fStack_2454 * fStack_1654 + fStack_23f4 * fStack_10d4 + fStack_1634 * fStack_e54;
          fVar88 = fStack_2450 * fStack_1650 + fStack_23f0 * fStack_10d0 + fStack_1630 * fStack_e50;
          fVar93 = fStack_244c * fStack_164c + fStack_23ec * fStack_10cc + fStack_162c * fStack_e4c;
          fVar98 = fStack_2448 * fStack_1648 + fStack_23e8 * fStack_10c8 + fStack_1628 * fStack_e48;
          fStack_2444 = fStack_2444 + fStack_23e4 + fStack_1624;
          auVar40._4_4_ = fVar73;
          auVar40._0_4_ = fVar68;
          auVar40._12_4_ = fVar83;
          auVar40._8_4_ = fVar78;
          auVar40._20_4_ = fVar93;
          auVar40._16_4_ = fVar88;
          auVar40._28_4_ = fStack_2444;
          auVar40._24_4_ = fVar98;
          auVar13 = vsubps_avx(auVar41,auVar40);
          local_4420 = auVar13._0_8_;
          uStack_4418 = auVar13._8_8_;
          uStack_4410 = auVar13._16_8_;
          uStack_4408 = auVar13._24_8_;
          auVar7 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40800000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40800000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x40800000),ZEXT416(0x40800000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40800000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x40800000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbfa00000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbfa00000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xbfa00000),ZEXT416(0xbfa00000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbfa00000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbfa00000),0x30);
          local_24c0 = auVar10._0_4_;
          fStack_24bc = auVar10._4_4_;
          fStack_24b8 = auVar10._8_4_;
          fStack_24b4 = auVar10._12_4_;
          fStack_24b0 = auVar9._0_4_;
          fStack_24ac = auVar9._4_4_;
          fStack_24a8 = auVar9._8_4_;
          local_2520 = auVar8._0_4_;
          fStack_251c = auVar8._4_4_;
          fStack_2518 = auVar8._8_4_;
          fStack_2514 = auVar8._12_4_;
          fStack_2510 = auVar7._0_4_;
          fStack_250c = auVar7._4_4_;
          fStack_2508 = auVar7._8_4_;
          fStack_2504 = auVar7._12_4_;
          local_1620 = local_2520 * (local_24c0 * local_1120 + local_1600) + local_1620;
          fStack_161c = fStack_251c * (fStack_24bc * fStack_111c + fStack_15fc) + fStack_161c;
          fStack_1618 = fStack_2518 * (fStack_24b8 * fStack_1118 + fStack_15f8) + fStack_1618;
          fStack_1614 = fStack_2514 * (fStack_24b4 * fStack_1114 + fStack_15f4) + fStack_1614;
          fStack_1610 = fStack_2510 * (fStack_24b0 * fStack_1110 + fStack_15f0) + fStack_1610;
          fStack_160c = fStack_250c * (fStack_24ac * fStack_110c + fStack_15ec) + fStack_160c;
          fStack_1608 = fStack_2508 * (fStack_24a8 * fStack_1108 + fStack_15e8) + fStack_1608;
          auVar39._4_4_ = fStack_161c;
          auVar39._0_4_ = local_1620;
          auVar39._12_4_ = fStack_1614;
          auVar39._8_4_ = fStack_1618;
          auVar39._20_4_ = fStack_160c;
          auVar39._16_4_ = fStack_1610;
          auVar39._28_4_ = fStack_2504 + fStack_1604;
          auVar39._24_4_ = fStack_1608;
          auVar7 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f000000),0x20);
          auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f000000),0x30);
          auVar8 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f000000),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0xc0200000),0x30);
          auVar10 = vinsertps_avx(ZEXT416(0xc0200000),ZEXT416(0xc0200000),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(0xc0200000),0x30);
          auVar11 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(0x40000000),0x30);
          auVar12 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x20);
          auVar12 = vinsertps_avx(auVar12,ZEXT416(0x40000000),0x30);
          local_ea0 = auVar12._0_4_;
          fStack_e9c = auVar12._4_4_;
          fStack_e98 = auVar12._8_4_;
          fStack_e94 = auVar12._12_4_;
          fStack_e90 = auVar11._0_4_;
          fStack_e8c = auVar11._4_4_;
          fStack_e88 = auVar11._8_4_;
          local_2580 = auVar10._0_4_;
          fStack_257c = auVar10._4_4_;
          fStack_2578 = auVar10._8_4_;
          fStack_2574 = auVar10._12_4_;
          fStack_2570 = auVar9._0_4_;
          fStack_256c = auVar9._4_4_;
          fStack_2568 = auVar9._8_4_;
          fStack_2564 = auVar9._12_4_;
          local_25e0 = auVar8._0_4_;
          fStack_25dc = auVar8._4_4_;
          fStack_25d8 = auVar8._8_4_;
          fStack_25d4 = auVar8._12_4_;
          fStack_25d0 = auVar7._0_4_;
          fStack_25cc = auVar7._4_4_;
          fStack_25c8 = auVar7._8_4_;
          fStack_25c4 = auVar7._12_4_;
          fVar69 = local_25e0 * local_1660 + local_2580 * local_10e0 + local_1640 * local_ea0;
          fVar74 = fStack_25dc * fStack_165c + fStack_257c * fStack_10dc + fStack_163c * fStack_e9c;
          fVar79 = fStack_25d8 * fStack_1658 + fStack_2578 * fStack_10d8 + fStack_1638 * fStack_e98;
          fVar84 = fStack_25d4 * fStack_1654 + fStack_2574 * fStack_10d4 + fStack_1634 * fStack_e94;
          fVar89 = fStack_25d0 * fStack_1650 + fStack_2570 * fStack_10d0 + fStack_1630 * fStack_e90;
          fVar94 = fStack_25cc * fStack_164c + fStack_256c * fStack_10cc + fStack_162c * fStack_e8c;
          fVar99 = fStack_25c8 * fStack_1648 + fStack_2568 * fStack_10c8 + fStack_1628 * fStack_e88;
          fStack_25c4 = fStack_25c4 + fStack_2564 + fStack_1624;
          auVar38._4_4_ = fVar74;
          auVar38._0_4_ = fVar69;
          auVar38._12_4_ = fVar84;
          auVar38._8_4_ = fVar79;
          auVar38._20_4_ = fVar94;
          auVar38._16_4_ = fVar89;
          auVar38._28_4_ = fStack_25c4;
          auVar38._24_4_ = fVar99;
          auVar13 = vsubps_avx(auVar39,auVar38);
          local_4660 = auVar13._0_8_;
          uStack_4658 = auVar13._8_8_;
          uStack_4650 = auVar13._16_8_;
          uStack_4648 = auVar13._24_8_;
          *local_3568 = CONCAT44(fStack_21bc * fStack_119c + fStack_1a1c,
                                 local_21c0 * local_11a0 + local_1a20);
          local_3568[1] =
               CONCAT44(fStack_21b4 * fStack_1194 + fStack_1a14,
                        fStack_21b8 * fStack_1198 + fStack_1a18);
          local_3568[2] =
               CONCAT44(fStack_21ac * fStack_118c + fStack_1a0c,
                        fStack_21b0 * fStack_1190 + fStack_1a10);
          local_3568[3] =
               CONCAT44(fStack_21a4 + fStack_1a04,fStack_21a8 * fStack_1188 + fStack_1a08);
          *local_3570 = CONCAT44(fVar70 + fVar71,fVar65 + fVar66);
          local_3570[1] = CONCAT44(fVar80 + fVar81,fVar75 + fVar76);
          local_3570[2] = CONCAT44(fVar90 + fVar91,fVar85 + fVar86);
          local_3570[3] = CONCAT44(fStack_2264 + fStack_22c4,fVar95 + fVar96);
          *local_3578 = local_41c0;
          local_3578[1] = uStack_41b8;
          local_3578[2] = uStack_41b0;
          local_3578[3] = uStack_41a8;
          *local_3580 = CONCAT44(fVar72 + fVar73,fVar67 + fVar68);
          local_3580[1] = CONCAT44(fVar82 + fVar83,fVar77 + fVar78);
          local_3580[2] = CONCAT44(fVar92 + fVar93,fVar87 + fVar88);
          local_3580[3] = CONCAT44(fStack_2384 + fStack_2444,fVar97 + fVar98);
          *local_3588 = local_4420;
          local_3588[1] = uStack_4418;
          local_3588[2] = uStack_4410;
          local_3588[3] = uStack_4408;
          *local_3590 = CONCAT44(fStack_161c + fVar74,local_1620 + fVar69);
          local_3590[1] = CONCAT44(fStack_1614 + fVar84,fStack_1618 + fVar79);
          local_3590[2] = CONCAT44(fStack_160c + fVar94,fStack_1610 + fVar89);
          local_3590[3] = CONCAT44(fStack_2504 + fStack_1604 + fStack_25c4,fStack_1608 + fVar99);
          *local_3598 = local_4660;
          local_3598[1] = uStack_4658;
          local_3598[2] = uStack_4650;
          local_3598[3] = uStack_4648;
          *local_35a0 = auVar37;
          local_3568 = (undefined8 *)((long)local_3568 + (long)(iVar60 * 0x40) * 4);
          local_3570 = (undefined8 *)((long)local_3570 + (long)(iVar60 * 0x40) * 4);
          local_3578 = (undefined8 *)((long)local_3578 + (long)(iVar60 * 0x40) * 4);
          local_3580 = (undefined8 *)((long)local_3580 + (long)(iVar60 * 0x40) * 4);
          local_3588 = (undefined8 *)((long)local_3588 + (long)(iVar60 * 0x40) * 4);
          local_3590 = (undefined8 *)((long)local_3590 + (long)(iVar60 * 0x40) * 4);
          local_3598 = (undefined8 *)((long)local_3598 + (long)(iVar60 * 0x40) * 4);
          local_35a0 = (undefined1 (*) [32])(*local_35a0 + (long)(iVar60 * 0x40) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack8_avx(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[8][8][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 8;

                for (int m = 0; m < 8; m++)
                {
                    __m256 _r00 = _mm256_load_ps(r0);
                    __m256 _r01 = _mm256_load_ps(r0 + 8);
                    __m256 _r02 = _mm256_load_ps(r0 + 16);
                    __m256 _r03 = _mm256_load_ps(r0 + 24);
                    __m256 _r04 = _mm256_load_ps(r0 + 32);
                    __m256 _r05 = _mm256_load_ps(r0 + 40);
                    __m256 _r06 = _mm256_load_ps(r0 + 48);
                    __m256 _r07 = _mm256_load_ps(r0 + 56);

                    __m256 _tmp0m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r04, _r02), _mm256_sub_ps(_r00, _r06));
                    __m256 _tmp7m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r03, _r05), _mm256_sub_ps(_r07, _r01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r04, _mm256_add_ps(_r02, _r06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r03, _mm256_add_ps(_r01, _r05));

                    __m256 _tmp1m = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _tmp2m = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _r02, _r06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(0.5f))));

                    __m256 _tmp3m = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _tmp4m = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(2.f))));

                    __m256 _tmp5m = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _tmp6m = _mm256_sub_ps(_tmp56a, _tmp56b);

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    // old gcc breaks stack variable alignement
                    // ref https://gcc.gnu.org/bugzilla/show_bug.cgi?id=16660
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
                    _mm256_storeu_ps(tmp[4][m], _tmp4m);
                    _mm256_storeu_ps(tmp[5][m], _tmp5m);
                    _mm256_storeu_ps(tmp[6][m], _tmp6m);
                    _mm256_storeu_ps(tmp[7][m], _tmp7m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
                    _mm256_store_ps(tmp[4][m], _tmp4m);
                    _mm256_store_ps(tmp[5][m], _tmp5m);
                    _mm256_store_ps(tmp[6][m], _tmp6m);
                    _mm256_store_ps(tmp[7][m], _tmp7m);
#endif

                    r0 += w * 8;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 8;
                float* r0_tm_1 = r0_tm_0 + tiles * 8;
                float* r0_tm_2 = r0_tm_0 + tiles * 16;
                float* r0_tm_3 = r0_tm_0 + tiles * 24;
                float* r0_tm_4 = r0_tm_0 + tiles * 32;
                float* r0_tm_5 = r0_tm_0 + tiles * 40;
                float* r0_tm_6 = r0_tm_0 + tiles * 48;
                float* r0_tm_7 = r0_tm_0 + tiles * 56;

                for (int m = 0; m < 8; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_loadu_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_loadu_ps(tmp[m][7]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_load_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_load_ps(tmp[m][7]);
#endif

                    __m256 _r0tm0 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp04, _tmp02), _mm256_sub_ps(_tmp00, _tmp06));
                    __m256 _r0tm7 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp03, _tmp05), _mm256_sub_ps(_tmp07, _tmp01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp04, _mm256_add_ps(_tmp02, _tmp06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp03, _mm256_add_ps(_tmp01, _tmp05));

                    __m256 _r0tm1 = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _r0tm2 = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _tmp02, _tmp06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(0.5f))));

                    __m256 _r0tm3 = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _r0tm4 = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(2.f))));

                    __m256 _r0tm5 = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _r0tm6 = _mm256_sub_ps(_tmp56a, _tmp56b);

                    _mm256_store_ps(r0_tm_0, _r0tm0);
                    _mm256_store_ps(r0_tm_1, _r0tm1);
                    _mm256_store_ps(r0_tm_2, _r0tm2);
                    _mm256_store_ps(r0_tm_3, _r0tm3);
                    _mm256_store_ps(r0_tm_4, _r0tm4);
                    _mm256_store_ps(r0_tm_5, _r0tm5);
                    _mm256_store_ps(r0_tm_6, _r0tm6);
                    _mm256_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 64;
                    r0_tm_1 += tiles * 64;
                    r0_tm_2 += tiles * 64;
                    r0_tm_3 += tiles * 64;
                    r0_tm_4 += tiles * 64;
                    r0_tm_5 += tiles * 64;
                    r0_tm_6 += tiles * 64;
                    r0_tm_7 += tiles * 64;
                }
            }
        }
    }
}